

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cord.cc
# Opt level: O0

int __thiscall absl::Cord::CompareImpl(Cord *this,Cord *rhs)

{
  int iVar1;
  Cord *rhs_local;
  Cord *this_local;
  
  iVar1 = SharedCompareImpl<absl::Cord>(this,rhs);
  return iVar1;
}

Assistant:

int Cord::CompareImpl(const Cord& rhs) const {
  return SharedCompareImpl(*this, rhs);
}